

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O3

GLuint __thiscall
QOpenGL2PaintEngineExPrivate::bindTexture<QGradient>
          (QOpenGL2PaintEngineExPrivate *this,QGradient *gradient,bool *newTextureCreated)

{
  Data *pDVar1;
  GLuint GVar2;
  QOpenGL2GradientCache *this_00;
  QObject *context;
  
  pDVar1 = (this->ctx).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    context = (QObject *)0x0;
  }
  else {
    context = (this->ctx).wp.value;
  }
  this_00 = QOpenGL2GradientCache::cacheForContext((QOpenGLContext *)context);
  GVar2 = QOpenGL2GradientCache::getBuffer(this_00,gradient,1.0);
  if (newTextureCreated != (bool *)0x0) {
    *newTextureCreated = false;
  }
  if (GVar2 != this->lastTextureUsed) {
    (*(code *)**(undefined8 **)&this->funcs)(0xde1,GVar2);
  }
  return GVar2;
}

Assistant:

GLuint QOpenGL2PaintEngineExPrivate::bindTexture(const QGradient &gradient, bool *newTextureCreated)
{
    // We apply global opacity in the fragment shaders, so we always pass 1.0
    // for opacity to the cache.
    GLuint textureId = QOpenGL2GradientCache::cacheForContext(ctx)->getBuffer(gradient, 1.0);

    // QOpenGL2GradientCache::getBuffer() may bind and generate a new texture if it
    // hasn't been cached yet, but will otherwise return an unbound texture id. To
    // be sure that the texture is bound, we unfortunately have to bind again,
    // which results in the initial generation of the texture doing two binds.
    return bindTexture(textureId, newTextureCreated);
}